

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O0

void __thiscall
happly::TypedListProperty<unsigned_char>::writeDataASCII
          (TypedListProperty<unsigned_char> *this,ostream *outStream,size_t iElement)

{
  ulong uVar1;
  byte bVar2;
  reference pvVar3;
  ulong uVar4;
  runtime_error *this_00;
  ostream *this_01;
  byte *pbVar5;
  size_type in_RDX;
  ostream *in_RSI;
  long in_RDI;
  size_t iFlat;
  size_t dataCount;
  size_t dataEnd;
  size_t dataStart;
  size_type local_48;
  
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x40),
                      in_RDX);
  local_48 = *pvVar3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x40),
                      in_RDX + 1);
  uVar1 = *pvVar3;
  uVar4 = uVar1 - local_48;
  bVar2 = geometrycentral::surface::std::numeric_limits<unsigned_char>::max();
  if (bVar2 < uVar4) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,
               "List property has an element with more entries than fit in a uchar. See note in README."
              );
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ostream::operator<<(in_RSI,uVar4);
  geometrycentral::surface::std::ios_base::precision
            ((ios_base *)(in_RSI + *(long *)(*(long *)in_RSI + -0x18)),0);
  for (; local_48 < uVar1; local_48 = local_48 + 1) {
    this_01 = std::operator<<(in_RSI," ");
    pbVar5 = geometrycentral::surface::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
             operator[]((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x28),
                        local_48);
    std::ostream::operator<<(this_01,(uint)*pbVar5);
  }
  return;
}

Assistant:

virtual void writeDataASCII(std::ostream& outStream, size_t iElement) override {
    size_t dataStart = flattenedIndexStart[iElement];
    size_t dataEnd = flattenedIndexStart[iElement + 1];

    // Get the number of list elements as a uchar, and ensure the value fits
    size_t dataCount = dataEnd - dataStart;
    if (dataCount > std::numeric_limits<uint8_t>::max()) {
      throw std::runtime_error(
          "List property has an element with more entries than fit in a uchar. See note in README.");
    }

    outStream << dataCount;
    outStream.precision(std::numeric_limits<T>::max_digits10);
    for (size_t iFlat = dataStart; iFlat < dataEnd; iFlat++) {
      outStream << " " << static_cast<typename SerializeType<T>::type>(flattenedData[iFlat]); // cast is usually a no-op
    }
  }